

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedReservoirQuantileListAggregateFunction<signed_char,signed_char>(LogicalType *type)

{
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  LogicalType *in_stack_000000f0;
  LogicalType *in_stack_000000f8;
  
  ReservoirQuantileListAggregate<duckdb::ReservoirQuantileState<signed_char>,signed_char,duckdb::list_entry_t,duckdb::ReservoirQuantileListOperation<signed_char>>
            (in_stack_000000f8,in_stack_000000f0);
  return in_RDI;
}

Assistant:

AggregateFunction GetTypedReservoirQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ReservoirQuantileState<SAVE_TYPE>;
	using OP = ReservoirQuantileListOperation<INPUT_TYPE>;
	auto fun = ReservoirQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	return fun;
}